

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchriter.cpp
# Opt level: O3

UChar32 __thiscall
icu_63::UCharCharacterIterator::setIndex32(UCharCharacterIterator *this,int32_t position)

{
  int iVar1;
  int iVar2;
  char16_t *pcVar3;
  char16_t cVar4;
  uint uVar5;
  int iVar6;
  
  iVar1 = (this->super_CharacterIterator).begin;
  iVar2 = (this->super_CharacterIterator).end;
  iVar6 = position;
  if (iVar2 < position) {
    iVar6 = iVar2;
  }
  if (position < iVar1) {
    iVar6 = iVar1;
  }
  if (iVar6 < iVar2) {
    pcVar3 = this->text;
    cVar4 = pcVar3[iVar6];
    if ((iVar1 < iVar6) && ((cVar4 & 0xfc00U) == 0xdc00)) {
      iVar6 = iVar6 - (uint)((pcVar3[(long)iVar6 + -1] & 0xfc00U) == 0xd800);
      cVar4 = pcVar3[iVar6];
    }
    (this->super_CharacterIterator).pos = iVar6;
    uVar5 = (uint)(ushort)cVar4;
    if ((((cVar4 & 0xfc00U) == 0xd800) && (iVar6 + 1 != iVar2)) &&
       (((ushort)pcVar3[iVar6 + 1] & 0xfc00) == 0xdc00)) {
      uVar5 = (uint)(ushort)cVar4 * 0x400 + (uint)(ushort)pcVar3[iVar6 + 1] + 0xfca02400;
    }
    return uVar5;
  }
  (this->super_CharacterIterator).pos = iVar6;
  return 0xffff;
}

Assistant:

UChar32
UCharCharacterIterator::setIndex32(int32_t position) {
    if(position < begin) {
        position = begin;
    } else if(position > end) {
        position = end;
    }
    if(position < end) {
        U16_SET_CP_START(text, begin, position);
        int32_t i = this->pos = position;
        UChar32 c;
        U16_NEXT(text, i, end, c);
        return c;
    } else {
        this->pos = position;
        return DONE;
    }
}